

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

_Bool nuts_has_ipv6(void)

{
  int iVar1;
  nng_sockaddr local_a0;
  nng_udp *local_18;
  nng_udp *u;
  
  memset(&local_a0,0,0x88);
  local_a0.s_family = 4;
  local_a0._2_8_ = 0;
  local_a0._10_8_ = 0;
  local_a0.s_storage.sa_pad[1]._2_2_ = 0x100;
  iVar1 = nng_udp_open(&local_18,&local_a0);
  if (iVar1 == 0) {
    nng_udp_close(local_18);
  }
  return iVar1 == 0;
}

Assistant:

bool
nuts_has_ipv6(void)
{
	nng_sockaddr sa = { 0 };
	nng_udp     *u;
	int          rv;

	sa.s_in6.sa_family = NNG_AF_INET6;
	sa.s_in6.sa_port   = 0;
	memset(sa.s_in6.sa_addr, 0, 16);
	sa.s_in6.sa_addr[15] = 1;

	rv = nng_udp_open(&u, &sa);
	if (rv == 0) {
		nng_udp_close(u);
	}
	return (rv == 0 ? 1 : 0);
}